

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# MapLoader.cpp
# Opt level: O2

void __thiscall MapLoader::MapLoader(MapLoader *this,MapLoader *toCopy)

{
  string *psVar1;
  
  this->_vptr_MapLoader = (_func_int **)&PTR__MapLoader_0013ab00;
  psVar1 = (string *)operator_new(0x20);
  (psVar1->_M_dataplus)._M_p = (pointer)&psVar1->field_2;
  psVar1->_M_string_length = 0;
  (psVar1->field_2)._M_local_buf[0] = '\0';
  this->pMapFile = psVar1;
  std::__cxx11::string::_M_assign((string *)psVar1);
  return;
}

Assistant:

MapLoader::MapLoader(const MapLoader &toCopy) {
    pMapFile = new std::string();
    *pMapFile = *toCopy.pMapFile;
}